

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPrintFanio(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint fUseSupp;
  uint fUseCone;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  uint fUsePio;
  uint fUseFanio;
  uint local_4c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fUseFanio = 0;
  Extra_UtilGetoptReset();
  fUsePio = 0;
  fUseSupp = 0;
  fUseCone = 0;
  local_4c = 0;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar2 = Extra_UtilGetopt(argc,argv,"fiscmvh"), iVar2 == 0x76) {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          if (0x68 < iVar2) break;
          if (iVar2 == -1) {
            if (pNtk != (Abc_Ntk_t *)0x0) {
              if ((local_4c == 0) && (bVar1)) {
                if (fUseSupp + fUseCone + fUsePio + fUseFanio == 1) {
                  Abc_NtkPrintFanio(_stdout,pNtk,fUseFanio,fUsePio,fUseSupp,fUseCone);
                }
                else {
                  puts(
                      "Exactly one of the switches \"-f\", \"-i\", \"-s\", \"-c\" should be enabled."
                      );
                }
              }
              else {
                Abc_NtkPrintFanioNew(_stdout,pNtk,local_4c);
              }
              return 0;
            }
            pcVar3 = "Empty network.\n";
            iVar2 = -1;
            goto LAB_0024cf20;
          }
          if (iVar2 == 99) {
            fUseCone = fUseCone ^ 1;
          }
          else {
            if (iVar2 != 0x66) goto LAB_0024ce1f;
            fUseFanio = fUseFanio ^ 1;
          }
        }
        if (iVar2 != 0x69) break;
        fUsePio = fUsePio ^ 1;
      }
      if (iVar2 != 0x6d) break;
      local_4c = local_4c ^ 1;
    }
    if (iVar2 != 0x73) break;
    fUseSupp = fUseSupp ^ 1;
  }
LAB_0024ce1f:
  Abc_Print(-2,"usage: print_fanio [-fiscmvh]\n");
  Abc_Print(-2,"\t        prints the statistics about different objects in the network\n");
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fUseFanio == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-f    : toggles considering fanins/fanouts of all nodes [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fUsePio == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-i    : toggles considering fanins/fanouts of CI/CO [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fUseSupp == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s    : toggles considering TFO/TFI support sizes of CI/CO [default = %s]\n",
            pcVar3);
  pcVar3 = "yes";
  if (fUseCone == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-c    : toggles considering TFO/TFI cone sizes of CI/CO [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_4c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-m    : toggles printing MFFC sizes instead of fanouts [default = %s]\n",pcVar3);
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v    : toggles verbose way of printing the stats [default = %s]\n",pcVar4);
  pcVar3 = "\t-h    : print the command usage\n";
  iVar2 = -2;
LAB_0024cf20:
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandPrintFanio( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseFanio = 0;
    int fUsePio   = 0;
    int fUseSupp  = 0;
    int fUseCone  = 0;
    int fMffc     = 0;
    int fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fiscmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fUseFanio ^= 1;
            break;
        case 'i':
            fUsePio ^= 1;
            break;
        case 's':
            fUseSupp ^= 1;
            break;
        case 'c':
            fUseCone ^= 1;
            break;
        case 'm':
            fMffc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // print the nodes
    if ( fMffc || !fVerbose )
        Abc_NtkPrintFanioNew( stdout, pNtk, fMffc );
    else
    {
        if ( fUseFanio + fUsePio + fUseSupp + fUseCone == 1 )
            Abc_NtkPrintFanio( stdout, pNtk, fUseFanio, fUsePio, fUseSupp, fUseCone );
        else
            printf( "Exactly one of the switches \"-f\", \"-i\", \"-s\", \"-c\" should be enabled.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_fanio [-fiscmvh]\n" );
    Abc_Print( -2, "\t        prints the statistics about different objects in the network\n" );
    Abc_Print( -2, "\t-f    : toggles considering fanins/fanouts of all nodes [default = %s]\n", fUseFanio? "yes": "no" );
    Abc_Print( -2, "\t-i    : toggles considering fanins/fanouts of CI/CO [default = %s]\n", fUsePio? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggles considering TFO/TFI support sizes of CI/CO [default = %s]\n", fUseSupp? "yes": "no" );
    Abc_Print( -2, "\t-c    : toggles considering TFO/TFI cone sizes of CI/CO [default = %s]\n", fUseCone? "yes": "no" );
    Abc_Print( -2, "\t-m    : toggles printing MFFC sizes instead of fanouts [default = %s]\n", fMffc? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggles verbose way of printing the stats [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}